

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

bool __thiscall SQArray::Get(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQTable *pSVar5;
  bool bVar6;
  SQObjectType SVar7;
  SQObjectValue *pSVar8;
  
  bVar6 = nidx < (long)(this->_values)._size;
  if (bVar6 && -1 < nidx) {
    pSVar2 = (this->_values)._vals + nidx;
    pSVar8 = &(pSVar2->super_SQObject)._unVal;
    SVar7 = (pSVar2->super_SQObject)._type;
    if (SVar7 == OT_WEAKREF) {
      SVar7 = *(SQObjectType *)&pSVar8->pString->_sharedstate;
      pSVar8 = (SQObjectValue *)&pSVar8->pString->_next;
    }
    pSVar4 = pSVar8->pTable;
    SVar3 = (val->super_SQObject)._type;
    pSVar5 = (val->super_SQObject)._unVal.pTable;
    (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)pSVar4;
    (val->super_SQObject)._type = SVar7;
    if ((SVar7 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar6 && -1 < nidx;
}

Assistant:

bool Get(const SQInteger nidx,SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            SQObjectPtr &o = _values[nidx];
            val = _realval(o);
            return true;
        }
        else return false;
    }